

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.h
# Opt level: O2

bool __thiscall
google::protobuf::internal::ReflectionSchema::IsSplit(ReflectionSchema *this,FieldDescriptor *field)

{
  uint32_t *puVar1;
  char *pcVar2;
  int in_EDX;
  
  if (this->split_offset_ != -1) {
    puVar1 = this->offsets_;
    pcVar2 = FieldDescriptor::index(field,(char *)field,in_EDX);
    return SUB41(puVar1[(int)pcVar2] >> 0x1f,0);
  }
  return false;
}

Assistant:

bool IsSplit(const FieldDescriptor* field) const {
    return split_offset_ != -1 &&
           (offsets_[field->index()] & kSplitFieldOffsetMask) != 0;
  }